

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O0

void __thiscall
TPZHybridizeHDiv::GetAllConnectedCompElSides
          (TPZHybridizeHDiv *this,TPZInterpolatedElement *intel,int side,
          TPZStack<TPZCompElSide,_10> *celsidestack)

{
  int iVar1;
  int iVar2;
  TPZConnect *this_00;
  TPZGeoEl *pTVar3;
  TPZCompElSide **ppTVar4;
  TPZGeoEl *this_01;
  long in_RDI;
  int celmatid;
  TPZGeoEl *neigh;
  TPZCompElSide *cel;
  TPZCompElSide *__end2;
  TPZCompElSide *__begin2;
  TPZStack<TPZCompElSide,_10> *__range2;
  TPZStack<TPZCompElSide,_10> celstack;
  TPZGeoElSide gelside;
  TPZGeoEl *gel;
  TPZConnect *c;
  bool isrestrained;
  size_t in_stack_00000258;
  char *in_stack_00000260;
  undefined8 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  TPZGeoElSide *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  TPZInterpolatedElement *in_stack_fffffffffffffe68;
  TPZCompElSide local_170;
  TPZCompElSide local_160;
  int local_14c;
  TPZGeoEl *local_148;
  TPZCompElSide *local_140;
  TPZCompElSide *local_138;
  TPZCompElSide *local_130;
  TPZVec<TPZCompElSide> *local_128;
  TPZVec<TPZCompElSide> local_120 [3];
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  TPZStack<TPZCompElSide,_10> *in_stack_ffffffffffffff48;
  TPZGeoElSide *in_stack_ffffffffffffff50;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  this_00 = TPZInterpolatedElement::SideConnect
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,in_stack_fffffffffffffe60
                      );
  iVar1 = TPZConnect::HasDependency(this_00);
  pTVar3 = TPZCompEl::Reference
                     ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  TPZGeoElSide::TPZGeoElSide
            (in_stack_fffffffffffffe50,
             (TPZGeoEl *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),iVar2);
  if (iVar1 == 0) {
    TPZStack<TPZCompElSide,_10>::TPZStack((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffe50);
    TPZGeoElSide::EqualLevelCompElementList
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
               in_stack_ffffffffffffff40);
    local_128 = local_120;
    ppTVar4 = TPZVec<TPZCompElSide>::begin(local_128);
    local_130 = *ppTVar4;
    local_138 = TPZVec<TPZCompElSide>::end(local_128);
    for (; local_130 != local_138; local_130 = local_130 + 1) {
      local_140 = local_130;
      TPZCompElSide::Element(local_130);
      local_148 = TPZCompEl::Reference
                            ((TPZCompEl *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      iVar1 = (**(code **)(*(long *)local_148 + 0x210))();
      iVar2 = (**(code **)(*(long *)pTVar3 + 0x210))();
      if (iVar1 == iVar2) {
        TPZCompElSide::Element(local_140);
        this_01 = TPZCompEl::Reference
                            ((TPZCompEl *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        in_stack_fffffffffffffe4c = TPZGeoEl::MaterialId(this_01);
        local_14c = in_stack_fffffffffffffe4c;
        if (*(int *)(in_RDI + 0x18) == -1000) {
          TPZCompElSide::TPZCompElSide(&local_170,local_140);
          TPZStack<TPZCompElSide,_10>::push_back
                    ((TPZStack<TPZCompElSide,_10> *)this_01,
                     (TPZCompElSide *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
          ;
        }
        else if (in_stack_fffffffffffffe4c == *(int *)(in_RDI + 0x18)) {
          TPZCompElSide::TPZCompElSide(&local_160,local_140);
          TPZStack<TPZCompElSide,_10>::push_back
                    ((TPZStack<TPZCompElSide,_10> *)this_01,
                     (TPZCompElSide *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
          ;
        }
      }
    }
    TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x1f54852);
  }
  else {
    pzinternal::DebugStopImpl(in_stack_00000260,in_stack_00000258);
  }
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1f5485f);
  return;
}

Assistant:

void TPZHybridizeHDiv::GetAllConnectedCompElSides(TPZInterpolatedElement *intel, int side, TPZStack<TPZCompElSide> &celsidestack) {
    bool isrestrained = false;
    {
        TPZConnect &c = intel->SideConnect(0, side);
        if (c.HasDependency()) {
            isrestrained = true;
        }
    }
    TPZGeoEl *gel = intel->Reference();
    TPZGeoElSide gelside(gel, side);

    if (isrestrained == true) {
        /// if the side is restrained we will hybridize between the element and the larger element
        DebugStop();
    } else {
        // if the connect is not restrained
        // - the neighbour should be of the same dimension
        //   if the neighbour is of lower dimension it is a boundary element
        TPZStack<TPZCompElSide> celstack;
        gelside.EqualLevelCompElementList(celstack, 1, 0);
        for (auto& cel : celstack) {
            TPZGeoEl *neigh = cel.Element()->Reference();
            if (neigh->Dimension() == gel->Dimension()) {
                const int celmatid = cel.Element()->Reference()->MaterialId();
                if (fIdToHybridize != -1000) {
                    if (celmatid == fIdToHybridize) {
                        celsidestack.push_back(cel);
                    }
                }
                else {
                    celsidestack.push_back(cel);
                }
                
            }
        } // cel
    } // else
}